

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O1

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeQuad>::TPZCompElHDivCollapsed
          (TPZCompElHDivCollapsed<pzshape::TPZShapeQuad> *this,TPZCompMesh *mesh,
          TPZCompElHDivCollapsed<pzshape::TPZShapeQuad> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long *plVar3;
  mapped_type_conflict *pmVar4;
  ostream *poVar5;
  size_t sVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  long lVar9;
  int64_t glIdx;
  stringstream sout;
  long local_1e8;
  pointer_____offset_0x60___ *local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  *(undefined ***)
   &(this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZSavable_0193e3b0;
  local_1e0 = &PTR_PTR_0193a9c0;
  TPZCompElHDiv<pzshape::TPZShapeQuad>::TPZCompElHDiv
            (&this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>,&PTR_PTR_0193a9c0,mesh,
             &copy->super_TPZCompElHDiv<pzshape::TPZShapeQuad>,gl2lcConMap,gl2lcElMap);
  *(undefined ***)
   &(this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZCompElHDivCollapsed_0193a5e8;
  *(undefined4 *)&this->fbottom_c_index = 0xffffffff;
  *(undefined4 *)((long)&this->fbottom_c_index + 4) = 0xffffffff;
  *(undefined4 *)&this->ftop_c_index = 0xffffffff;
  *(undefined4 *)((long)&this->ftop_c_index + 4) = 0xffffffff;
  this->fbottom_side_orient = -1;
  this->ftop_side_orient = 1;
  (this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
  super_TPZInterpolatedElement.super_TPZInterpolationSpace.fPreferredOrder =
       (copy->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
       super_TPZInterpolatedElement.super_TPZInterpolationSpace.fPreferredOrder;
  p_Var1 = &(gl2lcConMap->_M_t)._M_impl.super__Rb_tree_header;
  lVar9 = 0;
  while( true ) {
    local_1e8 = (copy->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).fConnectIndexes.
                super_TPZVec<long>.fStore[lVar9];
    if (local_1e8 == -1) {
      (this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).fConnectIndexes.super_TPZVec<long>.fStore
      [lVar9] = -1;
      bVar2 = false;
    }
    else {
      p_Var8 = (gl2lcConMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
          p_Var8 = (&p_Var8->_M_left)[(long)*(size_t *)(p_Var8 + 1) < local_1e8]) {
        if (local_1e8 <= (long)*(size_t *)(p_Var8 + 1)) {
          p_Var7 = p_Var8;
        }
      }
      p_Var8 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var8 = p_Var7, local_1e8 < (long)*(size_t *)(p_Var7 + 1))) {
        p_Var8 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var8 == p_Var1) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"ERROR in : ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,
                   "TPZCompElHDivCollapsed<pzshape::TPZShapeQuad>::TPZCompElHDivCollapsed(TPZCompMesh &, const TPZCompElHDivCollapsed<TSHAPE> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TSHAPE = pzshape::TPZShapeQuad]"
                   ,0xd9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8," trying to clone the connect index: ",0x24);
        poVar5 = std::ostream::_M_insert<long>((long)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," wich is not in mapped connect indexes!",0x27);
        std::__cxx11::stringbuf::str();
        plVar3 = local_1d8;
        if (local_1d8 == (long *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a5d2a8);
        }
        else {
          sVar6 = strlen((char *)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)plVar3,sVar6);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        (this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).fConnectIndexes.super_TPZVec<long>.fStore
        [lVar9] = -1;
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        bVar2 = true;
      }
      else {
        pmVar4 = std::
                 map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                 operator[](gl2lcConMap,&local_1e8);
        (this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).fConnectIndexes.super_TPZVec<long>.fStore
        [lVar9] = *pmVar4;
        bVar2 = false;
      }
    }
    if (bVar2) break;
    lVar9 = lVar9 + 1;
    if (lVar9 == 5) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHDivCollapsed.cpp"
                 ,0x60);
    }
  }
  return;
}

Assistant:

TPZCompElHDivCollapsed<TSHAPE>::TPZCompElHDivCollapsed(TPZCompMesh &mesh,
												 const TPZCompElHDivCollapsed<TSHAPE> &copy,
												 std::map<int64_t,int64_t> & gl2lcConMap,
												 std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElHDivCollapsed::ClassId),
TPZCompElHDiv<TSHAPE>(mesh,copy,gl2lcConMap,gl2lcElMap)
{
	
	this-> fPreferredOrder = copy.fPreferredOrder;
	int i;
	for(i=0;i<=TSHAPE::NFacets;i++)
	{
		int64_t lcIdx = -1;
		int64_t glIdx = copy.fConnectIndexes[i];
		if(glIdx == -1)
		{
			// nothing to clone
			this->fConnectIndexes[i] = -1;
			continue;
		}
		if (gl2lcConMap.find(glIdx) != gl2lcConMap.end())
		{
			lcIdx = gl2lcConMap[glIdx];
		}
		else
		{
			std::stringstream sout;
			sout << "ERROR in : " << __PRETTY_FUNCTION__
			<< " trying to clone the connect index: " << glIdx
			<< " wich is not in mapped connect indexes!";
			LOGPZ_ERROR(logger, sout.str().c_str());
			this-> fConnectIndexes[i] = -1;
			return;
		}
		this-> fConnectIndexes[i] = lcIdx;
	}
    // write the code when this constructor is called
    // Initialize top and bottom connects properly if needed be!
    DebugStop();
}